

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O0

void __thiscall
CaDiCaL::LratChecker::conclude_unsat
          (LratChecker *this,ConclusionType conclusion,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *ids)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  reference pvVar4;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *__lhs;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *p_Var5;
  uint *puVar6;
  reference puVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  int in_ESI;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_RDI;
  unsigned_long *id;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  unsigned_long c_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4_1;
  int c;
  iterator __end4;
  iterator __begin4;
  vector<int,_std::allocator<int>_> *__range4;
  LratCheckerClause *d;
  LratCheckerClause **p;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff40;
  unsigned_long *in_stack_ffffffffffffff48;
  value_type vVar8;
  iterator in_stack_ffffffffffffff58;
  LratChecker *in_stack_ffffffffffffff60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_70;
  unsigned_long local_68;
  unsigned_long *local_60;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  uint local_44;
  int *local_40;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  unsigned_long *local_30;
  LratCheckerClause *local_28;
  LratCheckerClause **local_20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  if ((in_RDI._M_current[0x17] & 1) != 0) {
    fatal_message_start();
    fputs("already concluded\n",_stderr);
    fatal_message_end();
  }
  *(undefined1 *)(in_RDI._M_current + 0x17) = 1;
  if (local_c == 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back(in_stack_ffffffffffffff40);
    local_20 = find(in_stack_ffffffffffffff60,(uint64_t)in_stack_ffffffffffffff58._M_current);
    local_28 = *local_20;
    if ((local_28 == (LratCheckerClause *)0x0) || (local_28->size != 0)) {
      fatal_message_start();
      fputs("empty clause not in proof\n",_stderr);
      fatal_message_end();
    }
  }
  else if (local_c == 2) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
    if ((sVar2 != 1) ||
       (sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           (in_RDI._M_current + 0x21)), sVar2 != 1)) {
      fatal_message_start();
      fputs("expected exactly one assumption clause\n",_stderr);
      fatal_message_end();
    }
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       (in_stack_ffffffffffffff40);
    vVar8 = *pvVar3;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       (in_stack_ffffffffffffff40);
    if (vVar8 != *pvVar4) {
      fatal_message_start();
      fputs("conclusion is not an assumption clause\n",_stderr);
      fatal_message_end();
    }
  }
  else {
    __lhs = (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *)std::vector<int,_std::allocator<int>_>::size
                         ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x14));
    p_Var5 = (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_18);
    if (__lhs != p_Var5) {
      fatal_message_start();
      fputs("not complete conclusion given for constraint\n",_stderr);
      fputs("The constraint contains the literals: ",_stderr);
      local_30 = in_RDI._M_current + 0x14;
      local_38._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
      local_40 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *
                                )__lhs,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                        *)in_stack_ffffffffffffff38), bVar1) {
        puVar6 = (uint *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator*(&local_38);
        local_44 = *puVar6;
        fprintf(_stderr,"%d ",(ulong)local_44);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&local_38);
      }
      fputs("\nThe ids are: ",_stderr);
      local_50 = local_18;
      local_58._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff38);
      local_60 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               (__lhs,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)in_stack_ffffffffffffff38), bVar1) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&local_58);
        local_68 = *puVar7;
        fprintf(_stderr,"%lu ",local_68);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_58);
      }
      fatal_message_end();
    }
    local_70 = local_18;
    local_78._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_ffffffffffffff38);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             (__lhs,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                     *)in_stack_ffffffffffffff38), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_78);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff38)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff38)
      ;
      std::
      find<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )in_stack_ffffffffffffff58._M_current,in_RDI,in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff58 =
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffff38);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)__lhs,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_ffffffffffffff38);
      if (!bVar1) {
        fatal_message_start();
        fputs("assumption clause for constraint missing\n",_stderr);
        fatal_message_end();
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_78);
    }
  }
  return;
}

Assistant:

void LratChecker::conclude_unsat (ConclusionType conclusion,
                                  const vector<uint64_t> &ids) {
  if (concluded) {
    fatal_message_start ();
    fputs ("already concluded\n", stderr);
    fatal_message_end ();
  }
  concluded = true;
  if (conclusion == CONFLICT) {
    LratCheckerClause **p = find (ids.back ()), *d = *p;
    if (!d || d->size) {
      fatal_message_start ();
      fputs ("empty clause not in proof\n", stderr);
      fatal_message_end ();
    }
    return;
  } else if (conclusion == ASSUMPTIONS) {
    if (ids.size () != 1 || assumption_clauses.size () != 1) {
      fatal_message_start ();
      fputs ("expected exactly one assumption clause\n", stderr);
      fatal_message_end ();
    }
    if (ids.back () != assumption_clauses.back ()) {
      fatal_message_start ();
      fputs ("conclusion is not an assumption clause\n", stderr);
      fatal_message_end ();
    }
    return;
  } else {
    assert (conclusion == CONSTRAINT);
    if (constraint.size () != ids.size ()) {
      fatal_message_start ();
      fputs ("not complete conclusion given for constraint\n", stderr);
      fputs ("The constraint contains the literals: ", stderr);
      for (auto c : constraint) {
        fprintf (stderr, "%d ", c);
      }

      fputs ("\nThe ids are: ", stderr);
      for (auto c : ids) {
        fprintf (stderr, "%" PRIu64 " ", c);
      }
      fatal_message_end ();
    }
    for (auto &id : ids) {
      if (std::find (assumption_clauses.begin (), assumption_clauses.end (),
                     id) != assumption_clauses.end ())
        continue;
      fatal_message_start ();
      fputs ("assumption clause for constraint missing\n", stderr);
      fatal_message_end ();
    }
  }
}